

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_queue.hpp
# Opt level: O3

void __thiscall
asio::detail::op_queue<asio::detail::reactor_op>::~op_queue
          (op_queue<asio::detail::reactor_op> *this)

{
  reactor_op *prVar1;
  error_category *peVar2;
  reactor_op *tmp;
  reactor_op *prVar3;
  error_code local_30;
  
  prVar3 = this->front_;
  if (prVar3 != (reactor_op *)0x0) {
    peVar2 = (error_category *)std::_V2::system_category();
    do {
      prVar1 = (reactor_op *)(prVar3->super_operation).next_;
      this->front_ = prVar1;
      if (prVar1 == (reactor_op *)0x0) {
        this->back_ = (reactor_op *)0x0;
      }
      (prVar3->super_operation).next_ = (scheduler_operation *)0x0;
      local_30._M_value = 0;
      local_30._M_cat = peVar2;
      (*(prVar3->super_operation).func_)((void *)0x0,&prVar3->super_operation,&local_30,0);
      prVar3 = this->front_;
    } while (prVar3 != (reactor_op *)0x0);
  }
  return;
}

Assistant:

~op_queue()
  {
    while (Operation* op = front_)
    {
      pop();
      op_queue_access::destroy(op);
    }
  }